

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

void __thiscall duckdb_shell::ShellState::ClearTempFile(ShellState *this)

{
  int iVar1;
  
  if ((this->zTempFile != (char *)0x0) && (this->doXdgOpen == '\0')) {
    iVar1 = unlink(this->zTempFile);
    if (iVar1 == 0) {
      duckdb_shell_sqlite3_free(this->zTempFile);
      this->zTempFile = (char *)0x0;
    }
  }
  return;
}

Assistant:

void ShellState::ClearTempFile() {
	if (zTempFile == 0)
		return;
	if (doXdgOpen)
		return;
	if (shellDeleteFile(zTempFile))
		return;
	sqlite3_free(zTempFile);
	zTempFile = 0;
}